

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

void __thiscall cmCTest::AddSubmitFile(cmCTest *this,Part part,char *name)

{
  allocator local_41;
  value_type local_40;
  char *local_20;
  char *name_local;
  cmCTest *pcStack_10;
  Part part_local;
  cmCTest *this_local;
  
  local_20 = name;
  name_local._4_4_ = part;
  pcStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,name,&local_41);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->Parts[part].SubmitFiles,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

void cmCTest::AddSubmitFile(Part part, const char* name)
{
  this->Parts[part].SubmitFiles.push_back(name);
}